

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_Request_Metrics(FT_Face face,FT_Size_Request req)

{
  FT_Size_Metrics *metrics;
  FT_Size_Request_Type FVar1;
  FT_Size pFVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong c_;
  long lVar7;
  ulong b_;
  long lVar8;
  long lVar9;
  
  pFVar2 = face->size;
  metrics = &pFVar2->metrics;
  if ((face->face_flags & 1) == 0) {
    (pFVar2->metrics).descender = 0;
    (pFVar2->metrics).height = 0;
    (pFVar2->metrics).y_scale = 0;
    (pFVar2->metrics).ascender = 0;
    metrics->x_ppem = 0;
    metrics->y_ppem = 0;
    *(undefined4 *)&metrics->field_0x4 = 0;
    (pFVar2->metrics).x_scale = 0;
    (pFVar2->metrics).max_advance = 0;
    (pFVar2->metrics).x_scale = 0x10000;
    (pFVar2->metrics).y_scale = 0x10000;
    return 0;
  }
  FVar1 = req->type;
  switch(FVar1) {
  case FT_SIZE_REQUEST_TYPE_NOMINAL:
    uVar4 = (ulong)face->units_per_EM;
    uVar6 = uVar4;
    break;
  case FT_SIZE_REQUEST_TYPE_REAL_DIM:
    uVar4 = (long)face->ascender - (long)face->descender;
    uVar6 = uVar4;
    break;
  case FT_SIZE_REQUEST_TYPE_BBOX:
    uVar4 = (face->bbox).xMax - (face->bbox).xMin;
    uVar6 = (face->bbox).yMax - (face->bbox).yMin;
    break;
  case FT_SIZE_REQUEST_TYPE_CELL:
    uVar4 = (ulong)face->max_advance_width;
    uVar6 = (long)face->ascender - (long)face->descender;
    break;
  case FT_SIZE_REQUEST_TYPE_SCALES:
    lVar9 = req->width;
    (pFVar2->metrics).x_scale = lVar9;
    lVar8 = req->height;
    (pFVar2->metrics).y_scale = lVar8;
    if (lVar9 == 0) {
      (pFVar2->metrics).x_scale = lVar8;
    }
    else if (lVar8 == 0) {
      (pFVar2->metrics).y_scale = lVar9;
    }
    lVar9 = 0;
    lVar8 = 0;
    goto LAB_00218560;
  default:
    uVar4 = 0;
    uVar6 = 0;
  }
  b_ = -uVar4;
  if (0 < (long)uVar4) {
    b_ = uVar4;
  }
  c_ = -uVar6;
  if (0 < (long)uVar6) {
    c_ = uVar6;
  }
  lVar9 = req->width;
  if ((ulong)req->horiResolution != 0) {
    lVar8 = lVar9 * (ulong)req->horiResolution + 0x24;
    lVar9 = lVar8 >> 0x3f;
    lVar9 = (lVar8 / 0x12 + lVar9 >> 2) - lVar9;
  }
  lVar8 = req->height;
  if ((ulong)req->vertResolution != 0) {
    lVar7 = lVar8 * (ulong)req->vertResolution + 0x24;
    lVar8 = lVar7 >> 0x3f;
    lVar8 = (lVar7 / 0x12 + lVar8 >> 2) - lVar8;
  }
  lVar7 = req->height;
  if ((lVar7 != 0) || (req->width == 0)) {
    if (uVar6 == 0) {
      return 0x85;
    }
    lVar5 = -lVar8;
    if (0 < lVar8) {
      lVar5 = lVar8;
    }
    uVar3 = ((c_ >> 1) + lVar5 * 0x10000) / c_;
    uVar6 = -uVar3;
    if (-1 < lVar8) {
      uVar6 = uVar3;
    }
    (pFVar2->metrics).y_scale = uVar6;
  }
  if (req->width == 0) {
    (pFVar2->metrics).x_scale = (pFVar2->metrics).y_scale;
    lVar9 = FT_MulDiv(lVar8,b_,c_);
  }
  else {
    if (uVar4 == 0) {
      return 0x85;
    }
    lVar5 = -lVar9;
    if (0 < lVar9) {
      lVar5 = lVar9;
    }
    uVar4 = ((b_ >> 1) + lVar5 * 0x10000) / b_;
    uVar6 = -uVar4;
    if (-1 < lVar9) {
      uVar6 = uVar4;
    }
    (pFVar2->metrics).x_scale = uVar6;
  }
  if (lVar7 == 0) {
    (pFVar2->metrics).y_scale = (pFVar2->metrics).x_scale;
    lVar8 = FT_MulDiv(lVar9,c_,b_);
  }
  if (FVar1 == FT_SIZE_REQUEST_TYPE_CELL) {
    lVar7 = (pFVar2->metrics).x_scale;
    lVar5 = (pFVar2->metrics).y_scale;
    if (lVar7 < lVar5) {
      (pFVar2->metrics).y_scale = lVar7;
    }
    else {
      (pFVar2->metrics).x_scale = lVar5;
    }
  }
LAB_00218560:
  if (FVar1 != FT_SIZE_REQUEST_TYPE_NOMINAL) {
    lVar9 = (long)(int)(pFVar2->metrics).x_scale * (ulong)face->units_per_EM;
    lVar9 = lVar9 + 0x8000 + (lVar9 >> 0x3f) >> 0x10;
    lVar8 = (long)(int)(pFVar2->metrics).y_scale * (ulong)face->units_per_EM;
    lVar8 = lVar8 + 0x8000 + (lVar8 >> 0x3f) >> 0x10;
  }
  lVar9 = lVar9 + 0x20 >> 6;
  if (lVar9 < 0x10000) {
    lVar8 = lVar8 + 0x20 >> 6;
    if (lVar8 < 0x10000) {
      (pFVar2->metrics).x_ppem = (FT_UShort)lVar9;
      (pFVar2->metrics).y_ppem = (FT_UShort)lVar8;
      ft_recompute_scaled_metrics(face,metrics);
      return 0;
    }
    return 0x17;
  }
  return 0x17;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Request_Metrics( FT_Face          face,
                      FT_Size_Request  req )
  {
    FT_Error  error = FT_Err_Ok;

    FT_Size_Metrics*  metrics;


    metrics = &face->size->metrics;

    if ( FT_IS_SCALABLE( face ) )
    {
      FT_Long  w = 0, h = 0, scaled_w = 0, scaled_h = 0;


      switch ( req->type )
      {
      case FT_SIZE_REQUEST_TYPE_NOMINAL:
        w = h = face->units_per_EM;
        break;

      case FT_SIZE_REQUEST_TYPE_REAL_DIM:
        w = h = face->ascender - face->descender;
        break;

      case FT_SIZE_REQUEST_TYPE_BBOX:
        w = face->bbox.xMax - face->bbox.xMin;
        h = face->bbox.yMax - face->bbox.yMin;
        break;

      case FT_SIZE_REQUEST_TYPE_CELL:
        w = face->max_advance_width;
        h = face->ascender - face->descender;
        break;

      case FT_SIZE_REQUEST_TYPE_SCALES:
        metrics->x_scale = (FT_Fixed)req->width;
        metrics->y_scale = (FT_Fixed)req->height;
        if ( !metrics->x_scale )
          metrics->x_scale = metrics->y_scale;
        else if ( !metrics->y_scale )
          metrics->y_scale = metrics->x_scale;
        goto Calculate_Ppem;

      case FT_SIZE_REQUEST_TYPE_MAX:
        break;
      }

      /* to be on the safe side */
      if ( w < 0 )
        w = -w;

      if ( h < 0 )
        h = -h;

      scaled_w = FT_REQUEST_WIDTH ( req );
      scaled_h = FT_REQUEST_HEIGHT( req );

      /* determine scales */
      if ( req->height || !req->width )
      {
        if ( h == 0 )
        {
          FT_ERROR(( "FT_Request_Metrics: Divide by zero\n" ));
          error = FT_ERR( Divide_By_Zero );
          goto Exit;
        }

        metrics->y_scale = FT_DivFix( scaled_h, h );
      }

      if ( req->width )
      {
        if ( w == 0 )
        {
          FT_ERROR(( "FT_Request_Metrics: Divide by zero\n" ));
          error = FT_ERR( Divide_By_Zero );
          goto Exit;
        }

        metrics->x_scale = FT_DivFix( scaled_w, w );
      }
      else
      {
        metrics->x_scale = metrics->y_scale;
        scaled_w = FT_MulDiv( scaled_h, w, h );
      }

      if ( !req->height )
      {
        metrics->y_scale = metrics->x_scale;
        scaled_h = FT_MulDiv( scaled_w, h, w );
      }

      if ( req->type == FT_SIZE_REQUEST_TYPE_CELL )
      {
        if ( metrics->y_scale > metrics->x_scale )
          metrics->y_scale = metrics->x_scale;
        else
          metrics->x_scale = metrics->y_scale;
      }

  Calculate_Ppem:
      /* calculate the ppems */
      if ( req->type != FT_SIZE_REQUEST_TYPE_NOMINAL )
      {
        scaled_w = FT_MulFix( face->units_per_EM, metrics->x_scale );
        scaled_h = FT_MulFix( face->units_per_EM, metrics->y_scale );
      }

      scaled_w = ( scaled_w + 32 ) >> 6;
      scaled_h = ( scaled_h + 32 ) >> 6;
      if ( scaled_w > (FT_Long)FT_USHORT_MAX ||
           scaled_h > (FT_Long)FT_USHORT_MAX )
      {
        FT_ERROR(( "FT_Request_Metrics: Resulting ppem size too large\n" ));
        error = FT_ERR( Invalid_Pixel_Size );
        goto Exit;
      }

      metrics->x_ppem = (FT_UShort)scaled_w;
      metrics->y_ppem = (FT_UShort)scaled_h;

      ft_recompute_scaled_metrics( face, metrics );
    }
    else
    {
      FT_ZERO( metrics );
      metrics->x_scale = 1L << 16;
      metrics->y_scale = 1L << 16;
    }

  Exit:
    return error;
  }